

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  printTotalsDivider(this,&_testRunStats->totals);
  printTotals(this,&_testRunStats->totals);
  std::endl<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream);
  StreamingReporterBase<Catch::ConsoleReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,_testRunStats);
  return;
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTotals(_testRunStats.totals);
    stream << std::endl;
    StreamingReporterBase::testRunEnded(_testRunStats);
}